

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cc
# Opt level: O3

void __thiscall
tchecker::tck_simulate::hr_display_t::output_initial
          (hr_display_t *this,
          vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
          *v)

{
  pointer ptVar1;
  make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL> *pmVar2;
  make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL> *in_RAX;
  ostream *poVar3;
  overflow_error *this_00;
  make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL> *pmVar4;
  pointer ptVar5;
  const_state_sptr_t local_38;
  
  poVar3 = this->_os;
  local_38._t = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"--- Initial states: ",0x14);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  ptVar5 = (v->
           super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ptVar1 = (v->
           super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ptVar5 == ptVar1) {
      return;
    }
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)this->_os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
    local_38._t = (make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL> *)0x0;
    pmVar2 = (ptVar5->
             super__Tuple_impl<0UL,_unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>
             ).
             super__Tuple_impl<1UL,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>
             .
             super__Head_base<1UL,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_false>
             ._M_head_impl._t;
    if ((pmVar2 != (make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL> *)0x0) &&
       (pmVar4 = (make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL> *)
                 ((long)&((pmVar2[-1].super_state_t._zone._t)->super_zone_t)._dim + 1),
       pmVar2[-1].super_state_t._zone._t = pmVar4,
       pmVar4 == (make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL> *)0xfffffffffffffffe))
    break;
    local_38._t = pmVar2;
    output(this,&local_38);
    intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t(&local_38);
    ptVar5 = ptVar5 + 1;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"reference counter overflow");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

void hr_display_t::output_initial(std::vector<tchecker::zg::zg_t::sst_t> const & v)
{
  _os << "--- Initial states: " << std::endl;

  std::size_t i = 0;
  for (auto && [status, nexts, nextt] : v) {
    _os << i << ") ";
    output(tchecker::zg::const_state_sptr_t{nexts});
    ++i;
  }
}